

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::
MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
::~MapFlagList(MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
               *this)

{
  ~MapFlagList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~MapFlagList() {}